

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall
JetHead::ServerSocket::accept(ServerSocket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int fd;
  Socket *this_00;
  
  fd = ::accept((this->super_Socket).mFd,(sockaddr *)0x0,(socklen_t *)0x0);
  if (fd == -1) {
    this_00 = (Socket *)0x0;
    jh_log_print(3,"Socket *JetHead::ServerSocket::accept()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x36b,"Accept failed");
  }
  else {
    this_00 = (Socket *)
              operator_new(0x70,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                           ,0x365);
    Socket::Socket(this_00,fd);
    Socket::setConnected(this_00,true,1);
    this_00->mParent = &this->super_Socket;
  }
  return (int)this_00;
}

Assistant:

Socket *ServerSocket::accept()
{
	TRACE_BEGIN( LOG_LVL_INFO );
	Socket *new_sock = NULL;
	
	int res = ::accept( getFd(), NULL, NULL );

	if ( res != -1 )
	{
		new_sock = jh_new Socket( res );
		new_sock->setConnected( true );
		new_sock->setParent(this);
	}
	else
	{
		LOG_WARN_PERROR("Accept failed");
	}
	
	return new_sock;
}